

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O2

void __thiscall jrtplib::RTCPScheduler::CalculateNextRTCPTime(RTCPScheduler *this)

{
  RTPInternalSourceData *pRVar1;
  bool sender;
  RTPTime RVar2;
  
  pRVar1 = this->sources->owndata;
  if (pRVar1 == (RTPInternalSourceData *)0x0) {
    sender = false;
  }
  else {
    sender = (pRVar1->super_RTPSourceData).issender;
  }
  RVar2 = RTPTime::CurrentTime();
  (this->nextrtcptime).m_t = RVar2.m_t;
  RVar2 = CalculateTransmissionInterval(this,sender);
  (this->nextrtcptime).m_t = RVar2.m_t + (this->nextrtcptime).m_t;
  return;
}

Assistant:

void RTCPScheduler::CalculateNextRTCPTime()
{
	bool aresender = false;
	RTPSourceData *srcdat;
	
	if ((srcdat = sources.GetOwnSourceInfo()) != 0)
		aresender = srcdat->IsSender();
	
	nextrtcptime = RTPTime::CurrentTime();	
	nextrtcptime += CalculateTransmissionInterval(aresender);
}